

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn.c
# Opt level: O2

void bignum_from_string(bn *n,char *str,int nbytes)

{
  uint __line;
  ulong in_RAX;
  char *__assertion;
  ulong uVar1;
  ulong uStack_38;
  uint32_t tmp;
  
  if (n == (bn *)0x0) {
    __assertion = "n && \"n is null\"";
    __line = 100;
  }
  else if (str == (char *)0x0) {
    __assertion = "str && \"str is null\"";
    __line = 0x65;
  }
  else if (nbytes < 1) {
    __assertion = "nbytes > 0 && \"nbytes must be positive\"";
    __line = 0x66;
  }
  else if ((nbytes & 1U) == 0) {
    if ((nbytes & 6U) == 0) {
      uStack_38 = in_RAX;
      bignum_init(n);
      for (uVar1 = (ulong)(uint)nbytes; 7 < (long)uVar1; uVar1 = uVar1 - 8) {
        uStack_38 = uStack_38 & 0xffffffff;
        __isoc99_sscanf(str + (uVar1 - 8),"%8x",&tmp);
        n->array[0] = tmp;
        n = (bn *)((long)n + 4);
      }
      return;
    }
    __assertion = 
    "(nbytes % (sizeof(uint32_t) * 2)) == 0 && \"string length must be a multiple of (sizeof(DTYPE) * 2) characters\""
    ;
    __line = 0x68;
  }
  else {
    __assertion = "(nbytes & 1) == 0 && \"string format must be in hex -> equal number of bytes\"";
    __line = 0x67;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/nequ4tion[P]cpwntools/cpwn_extern/tiny-bignum-c/bn.c"
                ,__line,"void bignum_from_string(struct bn *, char *, int)");
}

Assistant:

void bignum_from_string(struct bn* n, char* str, int nbytes)
{
  require(n, "n is null");
  require(str, "str is null");
  require(nbytes > 0, "nbytes must be positive");
  require((nbytes & 1) == 0, "string format must be in hex -> equal number of bytes");
  require((nbytes % (sizeof(DTYPE) * 2)) == 0, "string length must be a multiple of (sizeof(DTYPE) * 2) characters");
  
  bignum_init(n);

  DTYPE tmp;                        /* DTYPE is defined in bn.h - uint{8,16,32,64}_t */
  int i = nbytes - (2 * WORD_SIZE); /* index into string */
  int j = 0;                        /* index into array */

  /* reading last hex-byte "MSB" from string first -> big endian */
  /* MSB ~= most significant byte / block ? :) */
  while (i >= 0)
  {
    tmp = 0;
    sscanf(&str[i], SSCANF_FORMAT_STR, &tmp);
    n->array[j] = tmp;
    i -= (2 * WORD_SIZE); /* step WORD_SIZE hex-byte(s) back in the string. */
    j += 1;               /* step one element forward in the array. */
  }
}